

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_mcrxr(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i32 ret;
  uint32_t uVar1;
  TCGv_i32 ret_00;
  TCGv_i32 ret_01;
  TCGv_i32 dst;
  TCGv_i32 t1;
  TCGv_i32 t0;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  ret_00 = tcg_temp_new_i32(tcg_ctx_00);
  ret_01 = tcg_temp_new_i32(tcg_ctx_00);
  uVar1 = crfD(ctx->opcode);
  ret = cpu_crf[uVar1];
  tcg_gen_extrl_i64_i32_ppc64(tcg_ctx_00,ret_00,cpu_so);
  tcg_gen_extrl_i64_i32_ppc64(tcg_ctx_00,ret_01,cpu_ov);
  tcg_gen_extrl_i64_i32_ppc64(tcg_ctx_00,ret,cpu_ca);
  tcg_gen_shli_i32_ppc64(tcg_ctx_00,ret_00,ret_00,3);
  tcg_gen_shli_i32_ppc64(tcg_ctx_00,ret_01,ret_01,2);
  tcg_gen_shli_i32_ppc64(tcg_ctx_00,ret,ret,1);
  tcg_gen_or_i32(tcg_ctx_00,ret,ret,ret_00);
  tcg_gen_or_i32(tcg_ctx_00,ret,ret,ret_01);
  tcg_temp_free_i32(tcg_ctx_00,ret_00);
  tcg_temp_free_i32(tcg_ctx_00,ret_01);
  tcg_gen_movi_i64_ppc64(tcg_ctx_00,cpu_so,0);
  tcg_gen_movi_i64_ppc64(tcg_ctx_00,cpu_ov,0);
  tcg_gen_movi_i64_ppc64(tcg_ctx_00,cpu_ca,0);
  return;
}

Assistant:

static void gen_mcrxr(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 dst = cpu_crf[crfD(ctx->opcode)];

    tcg_gen_trunc_tl_i32(tcg_ctx, t0, cpu_so);
    tcg_gen_trunc_tl_i32(tcg_ctx, t1, cpu_ov);
    tcg_gen_trunc_tl_i32(tcg_ctx, dst, cpu_ca);
    tcg_gen_shli_i32(tcg_ctx, t0, t0, 3);
    tcg_gen_shli_i32(tcg_ctx, t1, t1, 2);
    tcg_gen_shli_i32(tcg_ctx, dst, dst, 1);
    tcg_gen_or_i32(tcg_ctx, dst, dst, t0);
    tcg_gen_or_i32(tcg_ctx, dst, dst, t1);
    tcg_temp_free_i32(tcg_ctx, t0);
    tcg_temp_free_i32(tcg_ctx, t1);

    tcg_gen_movi_tl(tcg_ctx, cpu_so, 0);
    tcg_gen_movi_tl(tcg_ctx, cpu_ov, 0);
    tcg_gen_movi_tl(tcg_ctx, cpu_ca, 0);
}